

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.cpp
# Opt level: O2

Clause * Clasp::SatPreprocessor::Clause::newClause(Literal *lits,uint32 size)

{
  Clause *pCVar1;
  
  pCVar1 = (Clause *)operator_new((ulong)(size - 1) * 4 + 0x10);
  *(uint32 *)&pCVar1->field_0x8 = size & 0x3fffffff;
  pCVar1->lits_[0].rep_ = 0;
  memcpy(pCVar1->lits_,lits,(ulong)size << 2);
  return pCVar1;
}

Assistant:

SatPreprocessor::Clause* SatPreprocessor::Clause::newClause(const Literal* lits, uint32 size) {
	assert(size > 0);
	void* mem = ::operator new( sizeof(Clause) + (size-1)*sizeof(Literal) );
	return new (mem) Clause(lits, size);
}